

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_translate(bcf_hdr_t *dst_hdr,bcf_hdr_t *src_hdr,bcf1_t *line)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [8];
  kstring_t str_1;
  bcf_fmt_t *fmt;
  uint8_t *x_1;
  uint8_t *x;
  uint8_t *p;
  int dst_size_1;
  int src_size_1;
  int dst_id_1;
  int src_id_2;
  kstring_t str;
  bcf_info_t *info;
  uint8_t *vptr;
  int dst_size;
  int src_size;
  int dst_id;
  int src_id_1;
  int src_id;
  int dict;
  int i;
  bcf1_t *line_local;
  bcf_hdr_t *src_hdr_local;
  bcf_hdr_t *dst_hdr_local;
  
  if (line->errcode != 0) {
    fprintf(_stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
            ,0x8e6,"bcf_translate",(ulong)(uint)line->errcode);
    exit(1);
  }
  if (src_hdr->ntransl != -1) {
    if (src_hdr->ntransl == 0) {
      for (src_id_1 = 0; src_id_1 < 2; src_id_1 = src_id_1 + 1) {
        piVar5 = (int *)malloc((long)src_hdr->n[src_id_1] << 2);
        src_hdr->transl[src_id_1] = piVar5;
        for (src_id = 0; src_id < src_hdr->n[src_id_1]; src_id = src_id + 1) {
          if ((src_hdr->id[src_id_1][src_id].key == (char *)0x0) ||
             (dst_hdr->id[src_id_1][src_id].key == (char *)0x0)) {
            src_hdr->transl[src_id_1][src_id] = -1;
          }
          else if ((src_id < dst_hdr->n[src_id_1]) &&
                  (iVar4 = strcmp(src_hdr->id[src_id_1][src_id].key,
                                  dst_hdr->id[src_id_1][src_id].key), iVar4 == 0)) {
            src_hdr->transl[src_id_1][src_id] = -1;
          }
          else {
            iVar4 = bcf_hdr_id2int(dst_hdr,src_id_1,src_hdr->id[src_id_1][src_id].key);
            src_hdr->transl[src_id_1][src_id] = iVar4;
            src_hdr->ntransl = src_hdr->ntransl + 1;
          }
        }
      }
      if (src_hdr->ntransl == 0) {
        free(src_hdr->transl[0]);
        src_hdr->transl[0] = (int *)0x0;
        free(src_hdr->transl[1]);
        src_hdr->transl[1] = (int *)0x0;
        src_hdr->ntransl = -1;
      }
      if (src_hdr->ntransl == -1) {
        return 0;
      }
    }
    bcf_unpack(line,0xf);
    if (-1 < src_hdr->transl[1][line->rid]) {
      line->rid = src_hdr->transl[1][line->rid];
    }
    for (src_id = 0; src_id < (line->d).n_flt; src_id = src_id + 1) {
      iVar4 = (line->d).flt[src_id];
      if (-1 < src_hdr->transl[0][iVar4]) {
        (line->d).flt[src_id] = src_hdr->transl[0][iVar4];
      }
      (line->d).shared_dirty = (line->d).shared_dirty | 4;
    }
    for (src_id = 0; src_id < (int)((uint)*(undefined8 *)&line->field_0x10 & 0xffff);
        src_id = src_id + 1) {
      iVar4 = (line->d).info[src_id].key;
      iVar1 = src_hdr->transl[0][iVar4];
      if (-1 < iVar1) {
        if (iVar4 >> 7 == 0) {
          local_bc = 1;
        }
        else {
          local_bc = 2;
          if (iVar4 >> 0xf != 0) {
            local_bc = 3;
          }
        }
        if (iVar1 >> 7 == 0) {
          local_c0 = 1;
        }
        else {
          local_c0 = 2;
          if (iVar1 >> 0xf != 0) {
            local_c0 = 3;
          }
        }
        if (local_bc == local_c0) {
          (line->d).info[src_id].key = iVar1;
          piVar5 = (int *)((line->d).info[src_id].vptr +
                          -(long)(int)(*(uint *)&(line->d).info[src_id].field_0x1c & 0x7fffffff));
          if (local_c0 == 1) {
            *(char *)((long)piVar5 + 1) = (char)iVar1;
          }
          else if (local_c0 == 2) {
            *(short *)piVar5 = (short)iVar1;
          }
          else {
            *piVar5 = iVar1;
          }
        }
        else {
          str.s = (char *)((line->d).info + src_id);
          if (*(int *)&((bcf_info_t *)str.s)->field_0x1c < 0) {
            __assert_fail("!info->vptr_free",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                          ,0x926,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
          }
          memset(&dst_id_1,0,0x18);
          bcf_enc_int1((kstring_t *)&dst_id_1,iVar1);
          bcf_enc_size((kstring_t *)&dst_id_1,*(int *)(str.s + 8),*(int *)(str.s + 4));
          *(uint *)(str.s + 0x1c) =
               *(uint *)(str.s + 0x1c) & 0x80000000 | (uint)_dst_id_1 & 0x7fffffff;
          kputsn(*(char **)(str.s + 0x10),*(int *)(str.s + 0x18),(kstring_t *)&dst_id_1);
          *(size_t *)(str.s + 0x10) = str.m + (long)(int)(*(uint *)(str.s + 0x1c) & 0x7fffffff);
          *(uint *)(str.s + 0x1c) = *(uint *)(str.s + 0x1c) & 0x7fffffff | 0x80000000;
          *(int *)str.s = iVar1;
          (line->d).shared_dirty = (line->d).shared_dirty | 8;
        }
      }
    }
    for (src_id = 0; src_id < (int)((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff);
        src_id = src_id + 1) {
      iVar4 = (line->d).fmt[src_id].id;
      iVar1 = src_hdr->transl[0][iVar4];
      if (-1 < iVar1) {
        if (iVar4 >> 7 == 0) {
          local_c4 = 1;
        }
        else {
          local_c4 = 2;
          if (iVar4 >> 0xf != 0) {
            local_c4 = 3;
          }
        }
        if (iVar1 >> 7 == 0) {
          local_c8 = 1;
        }
        else {
          local_c8 = 2;
          if (iVar1 >> 0xf != 0) {
            local_c8 = 3;
          }
        }
        if (local_c4 == local_c8) {
          (line->d).fmt[src_id].id = iVar1;
          puVar2 = (line->d).fmt[src_id].p;
          uVar6 = *(uint *)&(line->d).fmt[src_id].field_0x1c & 0x7fffffff;
          uVar3 = (uint8_t)iVar1;
          if (local_c8 == 1) {
            puVar2[1 - (long)(int)uVar6] = uVar3;
          }
          else {
            dst_size_1._1_1_ = (uint8_t)((uint)iVar1 >> 8);
            if (local_c8 == 2) {
              puVar2[1 - (long)(int)uVar6] = uVar3;
              puVar2[2 - (long)(int)uVar6] = dst_size_1._1_1_;
            }
            else {
              puVar2[1 - (long)(int)uVar6] = uVar3;
              puVar2[2 - (long)(int)uVar6] = dst_size_1._1_1_;
              dst_size_1._2_1_ = (uint8_t)((uint)iVar1 >> 0x10);
              puVar2[3 - (long)(int)uVar6] = dst_size_1._2_1_;
              dst_size_1._3_1_ = (uint8_t)((uint)iVar1 >> 0x18);
              puVar2[4 - (long)(int)uVar6] = dst_size_1._3_1_;
            }
          }
        }
        else {
          str_1.s = (char *)((line->d).fmt + src_id);
          if (*(int *)&((bcf_fmt_t *)str_1.s)->field_0x1c < 0) {
            __assert_fail("!fmt->p_free",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                          ,0x946,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
          }
          memset(local_b8,0,0x18);
          bcf_enc_int1((kstring_t *)local_b8,iVar1);
          bcf_enc_size((kstring_t *)local_b8,*(int *)(str_1.s + 4),*(int *)(str_1.s + 0xc));
          *(uint *)(str_1.s + 0x1c) =
               *(uint *)(str_1.s + 0x1c) & 0x80000000 | local_b8._0_4_ & 0x7fffffff;
          kputsn(*(char **)(str_1.s + 0x10),*(int *)(str_1.s + 0x18),(kstring_t *)local_b8);
          *(size_t *)(str_1.s + 0x10) =
               str_1.m + (long)(int)(*(uint *)(str_1.s + 0x1c) & 0x7fffffff);
          *(uint *)(str_1.s + 0x1c) = *(uint *)(str_1.s + 0x1c) & 0x7fffffff | 0x80000000;
          *(int *)str_1.s = iVar1;
          (line->d).indiv_dirty = 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int bcf_translate(const bcf_hdr_t *dst_hdr, bcf_hdr_t *src_hdr, bcf1_t *line)
{
    int i;
    if ( line->errcode )
    {
        fprintf(stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n", __FILE__,__LINE__,__FUNCTION__,line->errcode);
        exit(1);
    }
    if ( src_hdr->ntransl==-1 ) return 0;    // no need to translate, all tags have the same id
    if ( !src_hdr->ntransl )  // called for the first time, see what needs translating
    {
        int dict;
        for (dict=0; dict<2; dict++)    // BCF_DT_ID and BCF_DT_CTG
        {
            src_hdr->transl[dict] = (int*) malloc(src_hdr->n[dict]*sizeof(int));
            for (i=0; i<src_hdr->n[dict]; i++)
            {
                if ( !src_hdr->id[dict][i].key || !dst_hdr->id[dict][i].key )    // gap left after removed BCF header lines
                    src_hdr->transl[dict][i] = -1;
                else if ( i>=dst_hdr->n[dict] || strcmp(src_hdr->id[dict][i].key,dst_hdr->id[dict][i].key) )
                {
                    src_hdr->transl[dict][i] = bcf_hdr_id2int(dst_hdr,dict,src_hdr->id[dict][i].key);
                    src_hdr->ntransl++;
                }
                else
                    src_hdr->transl[dict][i] = -1;
            }
        }
        if ( !src_hdr->ntransl )
        {
            free(src_hdr->transl[0]); src_hdr->transl[0] = NULL;
            free(src_hdr->transl[1]); src_hdr->transl[1] = NULL;
            src_hdr->ntransl = -1;
        }
        if ( src_hdr->ntransl==-1 ) return 0;
    }
    bcf_unpack(line,BCF_UN_ALL);

    // CHROM
    if ( src_hdr->transl[BCF_DT_CTG][line->rid] >=0 ) line->rid = src_hdr->transl[BCF_DT_CTG][line->rid];

    // FILTER
    for (i=0; i<line->d.n_flt; i++)
    {
        int src_id = line->d.flt[i];
        if ( src_hdr->transl[BCF_DT_ID][src_id] >=0 )
            line->d.flt[i] = src_hdr->transl[BCF_DT_ID][src_id];
        line->d.shared_dirty |= BCF1_DIRTY_FLT;
    }

    // INFO
    for (i=0; i<line->n_info; i++)
    {
        int src_id = line->d.info[i].key;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.info[i].key = dst_id;
            uint8_t *vptr = line->d.info[i].vptr - line->d.info[i].vptr_off;
            if ( dst_size==BCF_BT_INT8 ) { vptr[1] = (uint8_t)dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { *(uint16_t*)vptr = (uint16_t)dst_id; }
            else { *(uint32_t*)vptr = (uint32_t)dst_id; }
        }
        else    // must realloc
        {
            bcf_info_t *info = &line->d.info[i];
            assert( !info->vptr_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, info->len,info->type);
            info->vptr_off = str.l;
            kputsn((char*)info->vptr, info->vptr_len, &str);
            info->vptr = (uint8_t*)str.s + info->vptr_off;
            info->vptr_free = 1;
            info->key = dst_id;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }

    // FORMAT
    for (i=0; i<line->n_fmt; i++)
    {
        int src_id = line->d.fmt[i].id;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.fmt[i].id = dst_id;
            uint8_t *p = line->d.fmt[i].p - line->d.fmt[i].p_off;    // pointer to the vector size (4bits) and BT type (4bits)
            if ( dst_size==BCF_BT_INT8 ) { p[1] = dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; }
            else { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; p[3] = x[2]; p[4] = x[3]; }
        }
        else    // must realloc
        {
            bcf_fmt_t *fmt = &line->d.fmt[i];
            assert( !fmt->p_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, fmt->n, fmt->type);
            fmt->p_off = str.l;
            kputsn((char*)fmt->p, fmt->p_len, &str);
            fmt->p = (uint8_t*)str.s + fmt->p_off;
            fmt->p_free = 1;
            fmt->id = dst_id;
            line->d.indiv_dirty = 1;
        }
    }
    return 0;
}